

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

void __thiscall sentencepiece::SentencePieceText::Clear(SentencePieceText *this)

{
  long in_RDI;
  uint32 cached_has_bits;
  ExtensionSet *in_stack_ffffffffffffffb0;
  
  google::protobuf::internal::ExtensionSet::Clear(in_stack_ffffffffffffffb0);
  google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::Clear
            ((RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *)0x44f072);
  if ((*(uint *)(in_RDI + 0x28) & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x44f0b3);
  }
  *(undefined4 *)(in_RDI + 0x50) = 0;
  memset((void *)(in_RDI + 0x28),0,4);
  if (((uint)((InternalMetadata *)(in_RDI + 8))->ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
              ((InternalMetadata *)(in_RDI + 8));
  }
  return;
}

Assistant:

void SentencePieceText::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  pieces_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    text_.ClearNonDefaultToEmpty();
  }
  score_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}